

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::SimpleTypeHandler<3UL>::MarkObjectSlots_TTD
          (SimpleTypeHandler<3UL> *this,SnapshotExtractor *extractor,DynamicObject *obj)

{
  uint uVar1;
  Var var;
  ulong uVar2;
  anon_union_8_2_5e5949cc_for_SimplePropertyDescriptor_1 *paVar3;
  
  uVar1 = this->propertyCount;
  if ((ulong)uVar1 != 0) {
    paVar3 = &this->descriptors[0].field_1;
    uVar2 = 0;
    do {
      if ((((((Type *)(paVar3 + -1))->Id).ptr)->pid - 0x10U < 0xffffffef) &&
         ((paVar3->Attributes & 8) == 0)) {
        var = DynamicObject::GetSlot(obj,(int)uVar2);
        TTD::SnapshotExtractor::MarkVisitVar(extractor,var);
      }
      uVar2 = uVar2 + 1;
      paVar3 = paVar3 + 2;
    } while (uVar1 != uVar2);
  }
  return;
}

Assistant:

void SimpleTypeHandler<size>::MarkObjectSlots_TTD(TTD::SnapshotExtractor* extractor, DynamicObject* obj) const
    {
        uint32 plength = this->propertyCount;

        for(uint32 index = 0; index < plength; ++index)
        {
            Js::PropertyId pid = this->descriptors[index].Id->GetPropertyId();

            if(DynamicTypeHandler::ShouldMarkPropertyId_TTD(pid) & !(this->descriptors[index].Attributes & PropertyDeleted))
            {
                Js::Var value = obj->GetSlot(index);
                extractor->MarkVisitVar(value);
            }
        }
    }